

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

bool __thiscall BinGE<0,_0,_0>::propagate(BinGE<0,_0,_0> *this)

{
  bool bVar1;
  Lit LVar2;
  IntView<0> *this_00;
  int64_t iVar3;
  IntView<0> *in_RDI;
  Reason m_r_1;
  int64_t m_v_1;
  Reason m_r;
  int64_t m_v;
  int64_t y_min;
  int64_t x_max;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  IntView<0> *in_stack_ffffffffffffff90;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffffa0;
  Lit p;
  undefined4 in_stack_ffffffffffffffac;
  char o;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffffb0;
  Reason local_30;
  int64_t local_28;
  int64_t local_20;
  int64_t local_18;
  
  o = (char)((uint)in_stack_ffffffffffffffac >> 0x18);
  local_18 = IntView<0>::getMax(in_stack_ffffffffffffff90);
  local_28 = IntView<0>::getMin(in_stack_ffffffffffffff90);
  local_20 = local_28;
  bVar1 = IntView<0>::setMinNotR
                    (in_stack_ffffffffffffff90,
                     CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  if (bVar1) {
    Reason::Reason(&local_30,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      IntView<0>::getMinLit
                ((IntView<0> *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      Reason::Reason((Reason *)in_RDI,(Lit)(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    }
    bVar1 = IntView<0>::setMin(in_RDI,(int64_t)in_stack_ffffffffffffff90,
                               (Reason)in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff8f);
    if (!bVar1) {
      return false;
    }
  }
  p.x = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  bVar1 = IntView<0>::setMaxNotR
                    (in_stack_ffffffffffffff90,
                     CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  if (bVar1) {
    Reason::Reason((Reason *)&stack0xffffffffffffffb0,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      LVar2 = IntView<0>::getMaxLit
                        ((IntView<0> *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)
                        );
      o = (char)((uint)LVar2.x >> 0x18);
      Reason::Reason((Reason *)in_RDI,p);
    }
    bVar1 = IntView<0>::setMax(in_RDI,(int64_t)in_stack_ffffffffffffff90,
                               (Reason)in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffff8f);
    if (!bVar1) {
      return false;
    }
  }
  this_00 = (IntView<0> *)IntView<0>::getMin(in_stack_ffffffffffffff90);
  iVar3 = IntView<0>::getMax(this_00);
  if (iVar3 <= (long)this_00) {
    Tchar::operator=((Tchar *)in_stack_ffffffffffffffb0._pt,o);
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}